

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

int Mvc_CoverSupportVarBelongs(Mvc_Cover_t *pCover,int iVar)

{
  uint uVar1;
  Mvc_Cube_t *pSupp;
  
  pSupp = Mvc_CubeAlloc(pCover);
  Mvc_CoverSupportAnd(pCover,pSupp);
  uVar1 = pSupp->pData[iVar >> 4];
  Mvc_CubeFree(pCover,pSupp);
  return (int)(((2 << ((byte)(iVar * 2) & 0x1f) | 1 << (iVar * 2 & 0x1fU)) & ~uVar1) != 0);
}

Assistant:

int Mvc_CoverSupportVarBelongs( Mvc_Cover_t * pCover, int iVar )
{
    Mvc_Cube_t * pSupp;
    int RetValue, v0, v1;
    // compute the support
    pSupp = Mvc_CubeAlloc( pCover );
    Mvc_CoverSupportAnd( pCover, pSupp );
    v0 = Mvc_CubeBitValue( pSupp, 2*iVar   );
    v1 = Mvc_CubeBitValue( pSupp, 2*iVar+1 );
    RetValue = (int)( !v0 || !v1 );
    Mvc_CubeFree( pCover, pSupp );
    return RetValue;
}